

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd.c
# Opt level: O3

void NJD_load(NJD *njd,char *str)

{
  _NJDNode *p_Var1;
  int iVar2;
  _NJDNode *node;
  NJDNode *pNVar3;
  int i;
  char pos [1024];
  char string [1024];
  char chain_flag [1024];
  char chain_rule [1024];
  char mora_size [1024];
  char acc [1024];
  char pron [1024];
  char read [1024];
  char orig [1024];
  char cform [1024];
  char ctype [1024];
  char pos_group3 [1024];
  char pos_group2 [1024];
  char pos_group1 [1024];
  int local_383c;
  char local_3838 [1024];
  char local_3438 [1024];
  char local_3038 [1024];
  char local_2c38 [1024];
  char local_2838 [1024];
  char local_2438 [1024];
  char local_2038 [1024];
  char local_1c38 [1024];
  char local_1838 [1024];
  char local_1438 [1024];
  char local_1038 [1024];
  char local_c38 [1024];
  char local_838 [1024];
  char local_438 [1032];
  
  local_383c = 0;
  if (*str == '\0') {
    NJD_load_cold_1();
  }
  else {
    get_token_from_string(str,&local_383c,local_3438,',');
    iVar2 = get_token_from_string(str,&local_383c,local_3838,',');
    if (0 < iVar2) {
      while ((((iVar2 = get_token_from_string(str,&local_383c,local_438,','), 0 < iVar2 &&
               (iVar2 = get_token_from_string(str,&local_383c,local_838,','), 0 < iVar2)) &&
              (iVar2 = get_token_from_string(str,&local_383c,local_c38,','), 0 < iVar2)) &&
             ((iVar2 = get_token_from_string(str,&local_383c,local_1038,','), 0 < iVar2 &&
              (iVar2 = get_token_from_string(str,&local_383c,local_1438,','), 0 < iVar2))))) {
        get_token_from_string(str,&local_383c,local_1838,',');
        get_token_from_string(str,&local_383c,local_1c38,',');
        get_token_from_string(str,&local_383c,local_2038,',');
        iVar2 = get_token_from_string(str,&local_383c,local_2438,'/');
        if (iVar2 < 1) {
          return;
        }
        iVar2 = get_token_from_string(str,&local_383c,local_2838,',');
        if (iVar2 < 1) {
          return;
        }
        get_token_from_string(str,&local_383c,local_2c38,',');
        iVar2 = get_token_from_string(str,&local_383c,local_3038,',');
        if (iVar2 < 1) {
          return;
        }
        node = (_NJDNode *)calloc(1,0x78);
        NJDNode_initialize(node);
        NJDNode_set_string(node,local_3438);
        NJDNode_set_pos(node,local_3838);
        NJDNode_set_pos_group1(node,local_438);
        NJDNode_set_pos_group2(node,local_838);
        NJDNode_set_pos_group3(node,local_c38);
        NJDNode_set_ctype(node,local_1038);
        NJDNode_set_cform(node,local_1438);
        NJDNode_set_orig(node,local_1838);
        NJDNode_set_read(node,local_1c38);
        NJDNode_set_pron(node,local_2038);
        iVar2 = atoi(local_2438);
        NJDNode_set_acc(node,iVar2);
        iVar2 = atoi(local_2838);
        NJDNode_set_mora_size(node,iVar2);
        NJDNode_set_chain_rule(node,local_2c38);
        iVar2 = atoi(local_3038);
        NJDNode_set_chain_flag(node,iVar2);
        if (njd->head == (NJDNode *)0x0) {
          njd->head = node;
        }
        else {
          p_Var1 = njd->tail;
          p_Var1->next = node;
          node->prev = p_Var1;
        }
        do {
          pNVar3 = node;
          node = pNVar3->next;
        } while (node != (_NJDNode *)0x0);
        njd->tail = pNVar3;
        get_token_from_string(str,&local_383c,local_3438,',');
        iVar2 = get_token_from_string(str,&local_383c,local_3838,',');
        if (iVar2 < 1) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void NJD_load(NJD * njd, const char *str)
{
   int i = 0;
   NJDNode *node = NULL;
   char string[MAXBUFLEN];
   char pos[MAXBUFLEN];
   char pos_group1[MAXBUFLEN];
   char pos_group2[MAXBUFLEN];
   char pos_group3[MAXBUFLEN];
   char ctype[MAXBUFLEN];
   char cform[MAXBUFLEN];
   char orig[MAXBUFLEN];
   char read[MAXBUFLEN];
   char pron[MAXBUFLEN];
   char acc[MAXBUFLEN];
   char mora_size[MAXBUFLEN];
   char chain_rule[MAXBUFLEN];
   char chain_flag[MAXBUFLEN];

   if (strlen(str) < 1) {
      fprintf(stderr, "WARNING: NJD_load() in njd.c: Input string should not be empty.");
      return;
   }

   while (1) {
      get_token_from_string(str, &i, string, ',');
      if (get_token_from_string(str, &i, pos, ',') <= 0)
         break;
      if (get_token_from_string(str, &i, pos_group1, ',') <= 0)
         break;
      if (get_token_from_string(str, &i, pos_group2, ',') <= 0)
         break;
      if (get_token_from_string(str, &i, pos_group3, ',') <= 0)
         break;
      if (get_token_from_string(str, &i, ctype, ',') <= 0)
         break;
      if (get_token_from_string(str, &i, cform, ',') <= 0)
         break;
      get_token_from_string(str, &i, orig, ',');
      get_token_from_string(str, &i, read, ',');
      get_token_from_string(str, &i, pron, ',');
      if (get_token_from_string(str, &i, acc, '/') <= 0)
         break;
      if (get_token_from_string(str, &i, mora_size, ',') <= 0)
         break;
      get_token_from_string(str, &i, chain_rule, ',');
      if (get_token_from_string(str, &i, chain_flag, ',') <= 0)
         break;
      node = (NJDNode *) calloc(1, sizeof(NJDNode));
      NJDNode_initialize(node);
      NJDNode_set_string(node, string);
      NJDNode_set_pos(node, pos);
      NJDNode_set_pos_group1(node, pos_group1);
      NJDNode_set_pos_group2(node, pos_group2);
      NJDNode_set_pos_group3(node, pos_group3);
      NJDNode_set_ctype(node, ctype);
      NJDNode_set_cform(node, cform);
      NJDNode_set_orig(node, orig);
      NJDNode_set_read(node, read);
      NJDNode_set_pron(node, pron);
      NJDNode_set_acc(node, atoi(acc));
      NJDNode_set_mora_size(node, atoi(mora_size));
      NJDNode_set_chain_rule(node, chain_rule);
      NJDNode_set_chain_flag(node, atoi(chain_flag));
      NJD_push_node(njd, node);
   }
}